

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_quotient(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  uint64_t lab_02;
  operand local_208;
  operation local_204 [2];
  operand local_1fc [2];
  operation local_1f4;
  operand local_1f0;
  operation local_1ec [2];
  operand local_1e4 [2];
  operation local_1dc;
  operand local_1d8 [2];
  operation local_1d0;
  operand local_1cc [2];
  operation local_1c4 [2];
  operand local_1bc [2];
  operation local_1b4 [3];
  operand local_1a8 [2];
  operation local_1a0 [3];
  operand local_194 [2];
  operation local_18c [3];
  operand local_180 [2];
  operation local_178;
  operand local_174 [2];
  operation local_16c [2];
  operand local_164 [2];
  operation local_15c;
  unsigned_long local_158;
  operand local_14c [2];
  operation local_144 [3];
  operand local_138 [2];
  operation local_130;
  operand local_12c [2];
  operation local_124 [2];
  operand local_11c [2];
  operation local_114;
  unsigned_long local_110;
  operand local_108 [2];
  operation local_100 [3];
  operand local_f4 [2];
  operation local_ec;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [8];
  string l2;
  undefined1 local_78 [8];
  string l1;
  string division_by_zero;
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  std::__cxx11::string::string((string *)(division_by_zero.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(l1.field_2._M_local_buf + 8));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_78,psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_a8,psVar1,lab_00);
  psVar1 = label;
  if ((ops->safe_primitives & 1U) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_c8,psVar1,lab_01);
    std::__cxx11::string::operator=
              ((string *)(division_by_zero.field_2._M_local_buf + 8),(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    psVar1 = label;
    label = label + 1;
    label_to_string_abi_cxx11_(&local_e8,psVar1,lab_02);
    std::__cxx11::string::operator=((string *)(l1.field_2._M_local_buf + 8),(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    local_ec = CMP;
    local_f4[1] = 0x14;
    local_f4[0] = NUMBER;
    local_100[2] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&local_ec,local_f4 + 1,local_f4,(int *)(local_100 + 2));
    local_100[1] = 0x30;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_100 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&division_by_zero.field_2 + 8));
  }
  jump_short_if_arg_is_not_block(code,RCX,R11,(string *)local_78);
  local_100[0] = AND;
  local_108[1] = 0xb;
  local_108[0] = NUMBER;
  local_110 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_100,local_108 + 1,local_108,&local_110);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_if_arg_does_not_point_to_flonum
              (code,RCX,R11,(string *)((long)&division_by_zero.field_2 + 8));
  }
  local_114 = MOVSD;
  local_11c[1] = 0x43;
  local_11c[0] = MEM_RCX;
  local_124[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_114,local_11c + 1,local_11c,(int *)(local_124 + 1));
  local_124[0] = CVTTSD2SI;
  local_12c[1] = 0xb;
  local_12c[0] = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_124,local_12c + 1,local_12c);
  local_130 = SHL;
  local_138[1] = 0xb;
  local_138[0] = NUMBER;
  local_144[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_130,local_138 + 1,local_138,(int *)(local_144 + 2));
  local_144[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_144 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  jump_short_if_arg_is_not_block(code,RDX,R11,(string *)local_a8);
  local_144[0] = AND;
  local_14c[1] = 0xc;
  local_14c[0] = NUMBER;
  local_158 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_144,local_14c + 1,local_14c,&local_158);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_if_arg_does_not_point_to_flonum
              (code,RDX,R11,(string *)((long)&division_by_zero.field_2 + 8));
  }
  local_15c = MOVSD;
  local_164[1] = 0x43;
  local_164[0] = MEM_RDX;
  local_16c[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_15c,local_164 + 1,local_164,(int *)(local_16c + 1));
  local_16c[0] = CVTTSD2SI;
  local_174[1] = 0xc;
  local_174[0] = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_16c,local_174 + 1,local_174);
  local_178 = SHL;
  local_180[1] = 0xc;
  local_180[0] = NUMBER;
  local_18c[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_178,local_180 + 1,local_180,(int *)(local_18c + 2));
  local_18c[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_18c + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  if ((ops->safe_primitives & 1U) != 0) {
    local_18c[0] = TEST;
    local_194[1] = 0xb;
    local_194[0] = NUMBER;
    local_1a0[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_18c,local_194 + 1,local_194,(int *)(local_1a0 + 2));
    local_1a0[1] = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_1a0 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&division_by_zero.field_2 + 8));
    local_1a0[0] = TEST;
    local_1a8[1] = 0xc;
    local_1a8[0] = NUMBER;
    local_1b4[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_1a0,local_1a8 + 1,local_1a8,(int *)(local_1b4 + 2));
    local_1b4[1] = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_1b4 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&division_by_zero.field_2 + 8));
    local_1b4[0] = TEST;
    local_1bc[1] = 0xc;
    local_1bc[0] = RDX;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,local_1b4,local_1bc + 1,local_1bc);
    local_1c4[1] = 0x38;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_1c4 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&l1.field_2 + 8));
  }
  local_1c4[0] = MOV;
  local_1cc[1] = 9;
  local_1cc[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_1c4,local_1cc + 1,local_1cc);
  local_1d0 = MOV;
  local_1d8[1] = 0xb;
  local_1d8[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_1d0,local_1d8 + 1,local_1d8);
  local_1dc = XOR;
  local_1e4[1] = 0xc;
  local_1e4[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_1dc,local_1e4 + 1,local_1e4);
  local_1ec[1] = 10;
  assembler::asmcode::add<assembler::asmcode::operation>(code,local_1ec + 1);
  local_1ec[0] = IDIV;
  local_1f0 = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_1ec,&local_1f0);
  local_1f4 = SHL;
  local_1fc[1] = 9;
  local_1fc[0] = NUMBER;
  local_204[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_1f4,local_1fc + 1,local_1fc,(int *)(local_204 + 1));
  local_204[0] = JMP;
  local_208 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_204,&local_208);
  if ((ops->safe_primitives & 1U) != 0) {
    error_label(code,(string *)((long)&division_by_zero.field_2 + 8),re_quotient_contract_violation)
    ;
    error_label(code,(string *)((long)&l1.field_2 + 8),re_division_by_zero);
  }
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(l1.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(division_by_zero.field_2._M_local_buf + 8));
  return;
}

Assistant:

void compile_quotient(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string division_by_zero;
  std::string l1 = label_to_string(label++);
  std::string l2 = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    division_by_zero = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JL, error);
    }
  jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, l1);
  //rcx is a block
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::MEM_RCX, CELLS(1));
  code.add(asmcode::CVTTSD2SI, asmcode::RCX, asmcode::XMM0);
  code.add(asmcode::SHL, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::LABEL, l1);

  jump_short_if_arg_is_not_block(code, asmcode::RDX, asmcode::R11, l2);
  //rdx is a block
  code.add(asmcode::AND, asmcode::RDX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RDX, asmcode::R11, error);
    }
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::MEM_RDX, CELLS(1));
  code.add(asmcode::CVTTSD2SI, asmcode::RDX, asmcode::XMM0);
  code.add(asmcode::SHL, asmcode::RDX, asmcode::NUMBER, 1);
  code.add(asmcode::LABEL, l2);

  if (ops.safe_primitives)
    {
    code.add(asmcode::TEST, asmcode::RCX, asmcode::NUMBER, 1);
    code.add(asmcode::JNE, error);
    code.add(asmcode::TEST, asmcode::RDX, asmcode::NUMBER, 1);
    code.add(asmcode::JNE, error);
    code.add(asmcode::TEST, asmcode::RDX, asmcode::RDX);
    code.add(asmcode::JES, division_by_zero);
    }
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::RCX, asmcode::RDX);
  code.add(asmcode::XOR, asmcode::RDX, asmcode::RDX);
  code.add(asmcode::CQO);
  code.add(asmcode::IDIV, asmcode::RCX);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_quotient_contract_violation);
    error_label(code, division_by_zero, re_division_by_zero);
    }
  }